

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::ArrayColumnData::InitializePrefetch
          (ArrayColumnData *this,PrefetchState *prefetch_state,ColumnScanState *scan_state,
          idx_t rows)

{
  LogicalType *type;
  idx_t iVar1;
  pointer pCVar2;
  reference pvVar3;
  ColumnScanState *in_RCX;
  PrefetchState *in_RDX;
  ColumnData *in_RSI;
  long in_RDI;
  idx_t array_size;
  size_type in_stack_ffffffffffffffa8;
  idx_t in_stack_ffffffffffffffd8;
  
  ColumnData::InitializePrefetch(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  type = (LogicalType *)(in_RDI + 0x118);
  vector<duckdb::ColumnScanState,_true>::operator[]
            ((vector<duckdb::ColumnScanState,_true> *)type,in_stack_ffffffffffffffa8);
  ColumnData::InitializePrefetch(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  iVar1 = ArrayType::GetSize(type);
  pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     ((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                       *)type);
  pvVar3 = vector<duckdb::ColumnScanState,_true>::operator[]
                     ((vector<duckdb::ColumnScanState,_true> *)type,in_stack_ffffffffffffffa8);
  (*pCVar2->_vptr_ColumnData[6])(pCVar2,in_RSI,pvVar3,(long)in_RCX * iVar1);
  return;
}

Assistant:

void ArrayColumnData::InitializePrefetch(PrefetchState &prefetch_state, ColumnScanState &scan_state, idx_t rows) {
	ColumnData::InitializePrefetch(prefetch_state, scan_state, rows);
	validity.InitializePrefetch(prefetch_state, scan_state.child_states[0], rows);
	auto array_size = ArrayType::GetSize(type);
	child_column->InitializePrefetch(prefetch_state, scan_state.child_states[1], rows * array_size);
}